

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,RegSlot R2)

{
  bool bVar1;
  undefined2 local_2c;
  undefined1 local_2a;
  undefined1 local_29;
  OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) && (local_2a = (undefined1)R1, R1 < 0x100)
      ) && (local_29 = (undefined1)R2, R2 < 0x100)) {
    local_2c = 4;
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_2c,4,this);
    AddJumpOffset(this,op,labelID,4);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg2(OpCode op, ByteCodeLabel labelID, RegSlot R1, RegSlot R2)
    {
        OpLayoutT_BrReg2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg2<SizePolicy>) - offsetof(OpLayoutT_BrReg2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }